

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.cpp
# Opt level: O2

int __thiscall ncnn::Scale::forward_inplace(Scale *this,Mat *bottom_top_blob,Option *opt)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer pMVar5;
  allocator_type local_39;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_top_blobs;
  
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector(&bottom_top_blobs,2,&local_39);
  pMVar5 = bottom_top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (bottom_top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start != bottom_top_blob) {
    piVar1 = bottom_top_blob->refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    piVar1 = (bottom_top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start)->refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if ((bottom_top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0) {
          free((bottom_top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start)->data);
        }
        else {
          (*(bottom_top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3])();
        }
      }
    }
    pMVar5->cstep = 0;
    pMVar5->data = (void *)0x0;
    pMVar5->refcount = (int *)0x0;
    *(undefined8 *)((long)&pMVar5->refcount + 4) = 0;
    *(undefined8 *)((long)&pMVar5->elemsize + 4) = 0;
    pMVar5->c = 0;
    pMVar5->dims = 0;
    pMVar5->w = 0;
    pMVar5->h = 0;
    pMVar5->d = 0;
    piVar1 = bottom_top_blob->refcount;
    pMVar5->data = bottom_top_blob->data;
    pMVar5->refcount = piVar1;
    pMVar5->elemsize = bottom_top_blob->elemsize;
    pMVar5->elempack = bottom_top_blob->elempack;
    pMVar5->allocator = bottom_top_blob->allocator;
    iVar4 = bottom_top_blob->w;
    iVar2 = bottom_top_blob->h;
    iVar3 = bottom_top_blob->d;
    pMVar5->dims = bottom_top_blob->dims;
    pMVar5->w = iVar4;
    pMVar5->h = iVar2;
    pMVar5->d = iVar3;
    pMVar5->c = bottom_top_blob->c;
    pMVar5->cstep = bottom_top_blob->cstep;
    pMVar5 = bottom_top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  if (pMVar5 + 1 != &this->scale_data) {
    piVar1 = (this->scale_data).refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    piVar1 = pMVar5[1].refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (pMVar5[1].allocator == (Allocator *)0x0) {
          free(pMVar5[1].data);
        }
        else {
          (*(pMVar5[1].allocator)->_vptr_Allocator[3])();
        }
      }
    }
    pMVar5[1].cstep = 0;
    *(undefined8 *)((long)&pMVar5[1].refcount + 4) = 0;
    *(undefined8 *)((long)&pMVar5[1].elemsize + 4) = 0;
    pMVar5[1].data = (void *)0x0;
    pMVar5[1].refcount = (int *)0x0;
    pMVar5[1].c = 0;
    pMVar5[1].dims = 0;
    pMVar5[1].w = 0;
    pMVar5[1].h = 0;
    pMVar5[1].d = 0;
    piVar1 = (this->scale_data).refcount;
    pMVar5[1].data = (this->scale_data).data;
    pMVar5[1].refcount = piVar1;
    pMVar5[1].elemsize = (this->scale_data).elemsize;
    pMVar5[1].elempack = (this->scale_data).elempack;
    pMVar5[1].allocator = (this->scale_data).allocator;
    iVar4 = (this->scale_data).w;
    iVar2 = (this->scale_data).h;
    iVar3 = (this->scale_data).d;
    pMVar5[1].dims = (this->scale_data).dims;
    pMVar5[1].w = iVar4;
    pMVar5[1].h = iVar2;
    pMVar5[1].d = iVar3;
    pMVar5[1].c = (this->scale_data).c;
    pMVar5[1].cstep = (this->scale_data).cstep;
  }
  iVar4 = (*(this->super_Layer)._vptr_Layer[8])(this,&bottom_top_blobs,opt);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&bottom_top_blobs);
  return iVar4;
}

Assistant:

int Scale::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    std::vector<Mat> bottom_top_blobs(2);
    bottom_top_blobs[0] = bottom_top_blob;
    bottom_top_blobs[1] = scale_data;

    return forward_inplace(bottom_top_blobs, opt);
}